

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

size_t __thiscall
anon_unknown.dwarf_3697931::filename_pos(anon_unknown_dwarf_3697931 *this,StringRef str,Style style)

{
  char cVar1;
  bool bVar2;
  Style SVar3;
  size_t sVar4;
  char *Str;
  StringRef local_40;
  size_type local_30;
  size_t pos;
  undefined1 auStack_20 [4];
  Style style_local;
  StringRef str_local;
  
  str_local.Data = str.Data;
  pos._4_4_ = (Style)str.Length;
  _auStack_20 = this;
  sVar4 = llvm::StringRef::size((StringRef *)auStack_20);
  if (sVar4 != 0) {
    sVar4 = llvm::StringRef::size((StringRef *)auStack_20);
    cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_20,sVar4 - 1);
    bVar2 = llvm::sys::path::is_separator(cVar1,pos._4_4_);
    if (bVar2) {
      sVar4 = llvm::StringRef::size((StringRef *)auStack_20);
      return sVar4 - 1;
    }
  }
  Str = separators(pos._4_4_);
  llvm::StringRef::StringRef(&local_40,Str);
  sVar4 = llvm::StringRef::size((StringRef *)auStack_20);
  local_30 = llvm::StringRef::find_last_of((StringRef *)auStack_20,local_40,sVar4 - 1);
  SVar3 = real_style(pos._4_4_);
  if ((SVar3 == windows) && (local_30 == 0xffffffffffffffff)) {
    sVar4 = llvm::StringRef::size((StringRef *)auStack_20);
    local_30 = llvm::StringRef::find_last_of((StringRef *)auStack_20,':',sVar4 - 2);
  }
  if (local_30 == 0xffffffffffffffff) {
LAB_0288976f:
    str_local.Length = 0;
  }
  else {
    if (local_30 == 1) {
      cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_20,0);
      bVar2 = llvm::sys::path::is_separator(cVar1,pos._4_4_);
      if (bVar2) goto LAB_0288976f;
    }
    str_local.Length = local_30 + 1;
  }
  return str_local.Length;
}

Assistant:

size_t filename_pos(StringRef str, Style style) {
    if (str.size() > 0 && is_separator(str[str.size() - 1], style))
      return str.size() - 1;

    size_t pos = str.find_last_of(separators(style), str.size() - 1);

    if (real_style(style) == Style::windows) {
      if (pos == StringRef::npos)
        pos = str.find_last_of(':', str.size() - 2);
    }

    if (pos == StringRef::npos || (pos == 1 && is_separator(str[0], style)))
      return 0;

    return pos + 1;
  }